

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O3

FunctionDef * __thiscall FunctionDef::toJson(FunctionDef *this,int index)

{
  QJsonValue *pQVar1;
  char cVar2;
  int in_EDX;
  long lVar3;
  undefined4 in_register_00000034;
  long lVar4;
  ArgumentDef *arg;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QLatin1String QVar6;
  QLatin1String QVar7;
  QByteArrayView QVar8;
  QLatin1String QVar9;
  QByteArrayView QVar10;
  QLatin1String QVar11;
  QLatin1String QVar12;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  undefined1 auVar16 [16];
  QJsonArray args;
  undefined1 local_78 [16];
  undefined1 local_68 [48];
  long local_38;
  
  lVar4 = CONCAT44(in_register_00000034,index);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->type).name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)this);
  QVar5.m_data = *(storage_type **)(lVar4 + 0x98);
  QVar5.m_size = (qsizetype)local_68;
  QString::fromUtf8(QVar5);
  pQVar1 = (QJsonValue *)(local_68 + 0x18);
  QJsonValue::QJsonValue(pQVar1,(QString *)local_68);
  QVar6.m_data = (char *)0x4;
  QVar6.m_size = (qsizetype)this;
  local_78 = QJsonObject::operator[](QVar6);
  QJsonValueRef::operator=((QJsonValueRef *)local_78,pQVar1);
  QJsonValue::~QJsonValue(pQVar1);
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  pQVar1 = (QJsonValue *)(local_68 + 0x18);
  QJsonValue::QJsonValue(pQVar1,in_EDX);
  QVar7.m_data = (char *)0x5;
  QVar7.m_size = (qsizetype)this;
  local_68._0_16_ = QJsonObject::operator[](QVar7);
  QJsonValueRef::operator=((QJsonValueRef *)local_68,pQVar1);
  QJsonValue::~QJsonValue(pQVar1);
  if (*(storage_type **)(lVar4 + 0x80) != (storage_type *)0x0) {
    QVar8.m_data = *(storage_type **)(lVar4 + 0x80);
    QVar8.m_size = (qsizetype)local_68;
    QString::fromUtf8(QVar8);
    pQVar1 = (QJsonValue *)(local_68 + 0x18);
    QJsonValue::QJsonValue(pQVar1,(QString *)local_68);
    QVar9.m_data = (char *)0x3;
    QVar9.m_size = (qsizetype)this;
    auVar16 = QJsonObject::operator[](QVar9);
    local_78 = auVar16;
    QJsonValueRef::operator=((QJsonValueRef *)local_78,pQVar1);
    QJsonValue::~QJsonValue(pQVar1);
    if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
  }
  QVar10.m_data = *(storage_type **)(lVar4 + 0x68);
  QVar10.m_size = (qsizetype)local_68;
  QString::fromUtf8(QVar10);
  pQVar1 = (QJsonValue *)(local_68 + 0x18);
  QJsonValue::QJsonValue(pQVar1,(QString *)local_68);
  QVar11.m_data = (char *)0xa;
  QVar11.m_size = (qsizetype)this;
  auVar16 = QJsonObject::operator[](QVar11);
  local_78 = auVar16;
  QJsonValueRef::operator=((QJsonValueRef *)local_78,pQVar1);
  QJsonValue::~QJsonValue(pQVar1);
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  if (*(char *)(lVar4 + 0xc0) == '\x01') {
    pQVar1 = (QJsonValue *)(local_68 + 0x18);
    QJsonValue::QJsonValue(pQVar1,true);
    QVar12.m_data = (char *)0x7;
    QVar12.m_size = (qsizetype)this;
    auVar16 = QJsonObject::operator[](QVar12);
    local_68._0_16_ = auVar16;
    QJsonValueRef::operator=((QJsonValueRef *)local_68,pQVar1);
    QJsonValue::~QJsonValue(pQVar1);
  }
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)local_78);
  if (*(long *)(lVar4 + 0x50) != 0) {
    lVar3 = *(long *)(lVar4 + 0x50) * 0xa8;
    do {
      ArgumentDef::toJson((ArgumentDef *)local_68);
      QJsonValue::QJsonValue((QJsonValue *)(local_68 + 0x18),(QJsonObject *)local_68);
      QJsonArray::append((QJsonValue *)local_78);
      QJsonValue::~QJsonValue((QJsonValue *)(local_68 + 0x18));
      QJsonObject::~QJsonObject((QJsonObject *)local_68);
      lVar3 = lVar3 + -0xa8;
    } while (lVar3 != 0);
  }
  cVar2 = QJsonArray::isEmpty();
  if (cVar2 == '\0') {
    pQVar1 = (QJsonValue *)(local_68 + 0x18);
    QJsonValue::QJsonValue(pQVar1,(QJsonArray *)local_78);
    QVar13.m_data = (char *)0x9;
    QVar13.m_size = (qsizetype)this;
    auVar16 = QJsonObject::operator[](QVar13);
    local_68._0_16_ = auVar16;
    QJsonValueRef::operator=((QJsonValueRef *)local_68,pQVar1);
    QJsonValue::~QJsonValue(pQVar1);
  }
  accessToJson((QJsonObject *)this,*(Access *)(lVar4 + 0xb8));
  if (0 < *(int *)(lVar4 + 0xbc)) {
    pQVar1 = (QJsonValue *)(local_68 + 0x18);
    QJsonValue::QJsonValue(pQVar1,*(int *)(lVar4 + 0xbc));
    QVar14.m_data = (char *)0x8;
    QVar14.m_size = (qsizetype)this;
    auVar16 = QJsonObject::operator[](QVar14);
    local_68._0_16_ = auVar16;
    QJsonValueRef::operator=((QJsonValueRef *)local_68,pQVar1);
    QJsonValue::~QJsonValue(pQVar1);
  }
  if (*(char *)(lVar4 + 0xc4) == '\x01') {
    pQVar1 = (QJsonValue *)(local_68 + 0x18);
    QJsonValue::QJsonValue(pQVar1,true);
    QVar15.m_data = (char *)0x8;
    QVar15.m_size = (qsizetype)this;
    auVar16 = QJsonObject::operator[](QVar15);
    local_68._0_16_ = auVar16;
    QJsonValueRef::operator=((QJsonValueRef *)local_68,pQVar1);
    QJsonValue::~QJsonValue(pQVar1);
  }
  QJsonArray::~QJsonArray((QJsonArray *)local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject FunctionDef::toJson(int index) const
{
    QJsonObject fdef;
    fdef["name"_L1] = QString::fromUtf8(name);
    fdef["index"_L1] = index;
    if (!tag.isEmpty())
        fdef["tag"_L1] = QString::fromUtf8(tag);
    fdef["returnType"_L1] = QString::fromUtf8(normalizedType);
    if (isConst)
        fdef["isConst"_L1] = true;

    QJsonArray args;
    for (const ArgumentDef &arg: arguments)
        args.append(arg.toJson());

    if (!args.isEmpty())
        fdef["arguments"_L1] = args;

    accessToJson(&fdef, access);

    if (revision > 0)
        fdef["revision"_L1] = revision;

    if (wasCloned)
        fdef["isCloned"_L1] = true;

    return fdef;
}